

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O3

void __thiscall Chromosome::mutate(Chromosome *this)

{
  pointer pTVar1;
  long lVar2;
  result_type_conflict2 rVar3;
  result_type_conflict2 rVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  char *this_00;
  uniform_int_distribution<int> randomTurnCode;
  uniform_int_distribution<int> randomAccess;
  type_data_t atStack_70 [4];
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
  *pvStack_68;
  __normal_iterator<const_TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> _Stack_60;
  __normal_iterator<const_TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> _Stack_58;
  Chromosome *pCStack_50;
  param_type *ppStack_48;
  random_device *prStack_40;
  param_type local_30;
  uniform_int_distribution<int> local_28;
  
  local_28._M_param._M_b =
       (int)((ulong)((long)(this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
  local_28._M_param._M_a = 0;
  local_30._M_a = 0;
  local_30._M_b = 2;
  prStack_40 = (random_device *)0x10ab59;
  rVar3 = std::uniform_int_distribution<int>::operator()
                    (&local_28,&randomDevice2,&local_28._M_param);
  prStack_40 = (random_device *)0x10ab69;
  rVar4 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_30,&randomDevice2,&local_30);
  pTVar1 = (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(long)rVar3 <
      (ulong)((long)(this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl
                    .super__Vector_impl_data._M_finish - (long)pTVar1 >> 2)) {
    pTVar1[rVar3] = rVar4 + LEFT;
    this->changed = true;
    idGlobal = idGlobal + 1;
    this->id = idGlobal;
    return;
  }
  this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  prStack_40 = (random_device *)printInfo;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  prStack_40 = &randomDevice2;
  pCStack_50 = this;
  ppStack_48 = &local_30;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"### Bester Kandidat ###",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pairs: ",7);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Collisions: ",0xc);
  plVar6 = (long *)std::ostream::operator<<
                             ((ostream *)&std::cout,((Chromosome *)this_00)->collisions);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fitness: ",9);
  poVar5 = std::ostream::_M_insert<double>(((Chromosome *)this_00)->fitness);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID: ",4);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,((Chromosome *)this_00)->id);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#######################",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  atStack_70[0].data = 2;
  _Stack_58._M_current =
       (((Chromosome *)this_00)->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
       _M_impl.super__Vector_impl_data._M_start;
  _Stack_60._M_current =
       (((Chromosome *)this_00)->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  pvStack_68 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
               ::
               create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,__gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,__gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>>
                         (&_Stack_58,&_Stack_60);
  lVar2 = *(long *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18));
  lVar7 = lVar2;
  if (lVar2 < 1) {
    lVar7 = 0;
  }
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::dump((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
          *)&atStack_70[0].bits,(ostream *)&std::cout,0 < lVar2,(uint)lVar7,0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  printCoordinates((Chromosome *)this_00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                 *)&atStack_70[0].bits);
  return;
}

Assistant:

void Chromosome::mutate() {
    std::uniform_int_distribution<int> randomAccess(0, (int) turnList.size()-1);
    std::uniform_int_distribution<int> randomTurnCode(0, 2);
    int position = randomAccess(randomDevice2) ;
    int mutation = randomTurnCode(randomDevice2) -1 ;
    turnList.at(position) = (TURNCODE) mutation;

    // Mark as changed for recalculation of fitness, collusion, path etc.
    this->changed = true;
    this->setId();
}